

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_states.hpp
# Opt level: O2

void __thiscall duckdb::MultiFileLocalState::~MultiFileLocalState(MultiFileLocalState *this)

{
  (this->super_LocalTableFunctionState)._vptr_LocalTableFunctionState =
       (_func_int **)&PTR__MultiFileLocalState_01798498;
  ExpressionExecutor::~ExpressionExecutor(&this->executor);
  DataChunk::~DataChunk(&this->scan_chunk);
  ::std::
  unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
  ::~unique_ptr(&(this->local_state).
                 super_unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
               );
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->reader).internal.
              super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  LocalTableFunctionState::~LocalTableFunctionState(&this->super_LocalTableFunctionState);
  return;
}

Assistant:

explicit MultiFileLocalState(ClientContext &context) : executor(context) {
	}